

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::GetClangTidyReplacementsFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *directory,
          cmSourceFile *source,string *config)

{
  ulong uVar1;
  cmGlobalNinjaGenerator *pcVar2;
  char local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string *local_78;
  string *objectName;
  string local_68;
  undefined1 local_31;
  string *local_30;
  string *config_local;
  cmSourceFile *source_local;
  string *directory_local;
  cmNinjaTargetGenerator *this_local;
  string *path;
  
  local_31 = 0;
  local_30 = config;
  config_local = (string *)source;
  source_local = (cmSourceFile *)directory;
  directory_local = (string *)this;
  this_local = (cmNinjaTargetGenerator *)__return_storage_ptr__;
  cmLocalNinjaGenerator::GetHomeRelativeOutputPath_abi_cxx11_
            (__return_storage_ptr__,this->LocalGenerator);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
  }
  objectName._7_1_ = 0x2f;
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
            (&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)source_local,
             (char *)((long)&objectName + 7),__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  local_78 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,
                        (cmSourceFile *)config_local);
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    super_cmOutputConverter._vptr_cmOutputConverter[0x10])
            (&local_b8,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar2 = GetGlobalGenerator(this);
  (*(pcVar2->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4d])
            (&local_d8,pcVar2,local_30);
  local_d9 = '/';
  cmStrCat<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[6]>
            (&local_98,__return_storage_ptr__,&local_b8,&local_d8,&local_d9,local_78,
             (char (*) [6])0x1285a70);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetClangTidyReplacementsFilePath(
  std::string const& directory, cmSourceFile const& source,
  std::string const& config) const
{
  auto path = this->LocalGenerator->GetHomeRelativeOutputPath();
  if (!path.empty()) {
    path += '/';
  }
  path = cmStrCat(directory, '/', path);
  auto const& objectName = this->GeneratorTarget->GetObjectName(&source);
  path =
    cmStrCat(std::move(path),
             this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
             this->GetGlobalGenerator()->ConfigDirectory(config), '/',
             objectName, ".yaml");
  return path;
}